

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::shadePrimitives
          (OutputCountShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets,
          int numPackets,int invocationID)

{
  GeometryEmitter *pGVar1;
  const_reference pvVar2;
  Vec4 *pVVar3;
  Vector<float,_4> local_90;
  Vec4 local_80;
  Vector<float,_4> local_70;
  Vec4 local_60;
  int local_50;
  int local_4c;
  int ndx;
  int emitCount;
  VertexPacket *vertex;
  float local_38;
  int packetNdx;
  float colWidth;
  float rowHeight;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  GeometryEmitter *pGStack_18;
  int verticesIn_local;
  GeometryEmitter *output_local;
  OutputCountShader *this_local;
  
  packetNdx = (int)(2.0 / (float)*(int *)&(this->super_ShaderProgram).field_0x154);
  local_38 = 2.0 / (float)this->m_patternMaxEmitCount;
  colWidth = (float)invocationID;
  rowHeight = (float)numPackets;
  _invocationID_local = packets;
  packets_local._4_4_ = verticesIn;
  pGStack_18 = output;
  output_local = (GeometryEmitter *)this;
  for (vertex._4_4_ = 0; vertex._4_4_ < (int)rowHeight; vertex._4_4_ = vertex._4_4_ + 1) {
    _ndx = _invocationID_local[vertex._4_4_].vertices[0];
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->m_spec).pattern,
                        (long)_invocationID_local[vertex._4_4_].primitiveIDIn);
    local_4c = *pvVar2;
    for (local_50 = 0; pGVar1 = pGStack_18, local_50 < local_4c / 2; local_50 = local_50 + 1) {
      pVVar3 = &_ndx->position;
      tcu::Vector<float,_4>::Vector(&local_70,(float)local_50 * 2.0 * local_38,0.0,0.0,0.0);
      tcu::operator+((tcu *)&local_60,pVVar3,&local_70);
      rr::GeometryEmitter::EmitVertex
                (pGVar1,&local_60,_ndx->pointSize,_ndx->outputs,
                 _invocationID_local[vertex._4_4_].primitiveIDIn);
      pGVar1 = pGStack_18;
      pVVar3 = &_ndx->position;
      tcu::Vector<float,_4>::Vector
                (&local_90,(float)local_50 * 2.0 * local_38,(float)packetNdx,0.0,0.0);
      tcu::operator+((tcu *)&local_80,pVVar3,&local_90);
      rr::GeometryEmitter::EmitVertex
                (pGVar1,&local_80,_ndx->pointSize,_ndx->outputs,
                 _invocationID_local[vertex._4_4_].primitiveIDIn);
    }
    rr::GeometryEmitter::EndPrimitive(pGStack_18);
  }
  return;
}

Assistant:

void OutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const float rowHeight	= 2.0f / (float)m_patternLength;
	const float colWidth	= 2.0f / (float)m_patternMaxEmitCount;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// Create triangle strip at this point
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		const int				emitCount	= m_spec.pattern[packets[packetNdx].primitiveIDIn];

		for (int ndx = 0; ndx < emitCount / 2; ++ndx)
		{
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, 0.0,       0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, rowHeight, 0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
		}
		output.EndPrimitive();
	}
}